

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpClient.cpp
# Opt level: O0

void __thiscall Liby::http::HttpClient::sendRequest(HttpClient *this)

{
  element_type *this_00;
  reference __x;
  element_type *__n;
  int in_R8D;
  anon_class_8_1_8991fb9c local_90;
  function<void_()> local_88;
  string local_58;
  undefined1 local_38 [8];
  Buffer buffer;
  Request *request;
  HttpClient *this_local;
  
  buffer.capacity_ =
       (off_t)std::__cxx11::
              list<std::pair<Liby::http::Request,_std::function<void_(Liby::http::Reply_&)>_>,_std::allocator<std::pair<Liby::http::Request,_std::function<void_(Liby::http::Reply_&)>_>_>_>
              ::front(&this->requestLists_);
  Buffer::Buffer((Buffer *)local_38,0x400);
  Request::toString_abi_cxx11_(&local_58,(Request *)buffer.capacity_);
  Buffer::append((Buffer *)local_38,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  Buffer::append((Buffer *)local_38,(Buffer *)(buffer.capacity_ + 0x80));
  this_00 = std::__shared_ptr_access<Liby::Connection,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<Liby::Connection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)&this->http_conn_);
  __n = this_00;
  local_90.this = this;
  std::function<void()>::function<Liby::http::HttpClient::sendRequest()::__0,void>
            ((function<void()> *)&local_88,&local_90);
  Connection::send(this_00,(int)local_38,&local_88,(size_t)__n,in_R8D);
  std::function<void_()>::~function(&local_88);
  __x = std::__cxx11::
        list<std::pair<Liby::http::Request,_std::function<void_(Liby::http::Reply_&)>_>,_std::allocator<std::pair<Liby::http::Request,_std::function<void_(Liby::http::Reply_&)>_>_>_>
        ::front(&this->requestLists_);
  std::__cxx11::
  list<std::pair<Liby::http::Request,_std::function<void_(Liby::http::Reply_&)>_>,_std::allocator<std::pair<Liby::http::Request,_std::function<void_(Liby::http::Reply_&)>_>_>_>
  ::push_back(&this->sendReqeustLists_,__x);
  std::__cxx11::
  list<std::pair<Liby::http::Request,_std::function<void_(Liby::http::Reply_&)>_>,_std::allocator<std::pair<Liby::http::Request,_std::function<void_(Liby::http::Reply_&)>_>_>_>
  ::pop_front(&this->requestLists_);
  Buffer::~Buffer((Buffer *)local_38);
  return;
}

Assistant:

void HttpClient::sendRequest() {
    auto &request = requestLists_.front().first;
    Buffer buffer(1024);
    buffer.append(request.toString());
    buffer.append(request.body_);
    http_conn_->send(buffer, [this] {
        http_conn_->enableRead();
        if (requestLists_.empty())
            return;
        sendRequest();
    });
    sendReqeustLists_.push_back(requestLists_.front());
    requestLists_.pop_front();
}